

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_simplify_intsubadd_rightcancel(jit_State *J)

{
  TRef TVar1;
  jit_State *J_local;
  
  if (((J->fold).ins.field_1.t.irt & 0x1f) != 0xe) {
    if (((J->fold).right[0].field_1.t.irt & 0x40) != 0) {
      return 0;
    }
    if ((J->fold).ins.field_0.op1 == (J->fold).right[0].field_0.op1) {
      (J->fold).ins.field_0.op2 = (J->fold).right[0].field_0.op2;
      TVar1 = lj_ir_kint(J,0);
      (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
      return 1;
    }
    if ((J->fold).ins.field_0.op1 == (J->fold).right[0].field_0.op2) {
      (J->fold).ins.field_0.op2 = (J->fold).right[0].field_0.op1;
      TVar1 = lj_ir_kint(J,0);
      (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
      return 1;
    }
  }
  return 0;
}

Assistant:

LJFOLD(SUB any ADD)
LJFOLDF(simplify_intsubadd_rightcancel)
{
  if (!irt_isnum(fins->t)) {
    PHIBARRIER(fright);
    if (fins->op1 == fright->op1) {  /* i - (i + j) ==> 0 - j */
      fins->op2 = fright->op2;
      fins->op1 = (IRRef1)lj_ir_kint(J, 0);
      return RETRYFOLD;
    }
    if (fins->op1 == fright->op2) {  /* i - (j + i) ==> 0 - j */
      fins->op2 = fright->op1;
      fins->op1 = (IRRef1)lj_ir_kint(J, 0);
      return RETRYFOLD;
    }
  }
  return NEXTFOLD;
}